

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  undefined4 uVar3;
  Layer *pLVar4;
  float fVar5;
  int *piVar6;
  int iVar7;
  undefined1 uVar8;
  int iVar9;
  uint uVar10;
  _func_int **pp_Var11;
  _func_int *p_Var12;
  long lVar13;
  int iVar14;
  undefined4 *puVar15;
  long lVar16;
  void *pvVar17;
  int iVar18;
  uint uVar19;
  int g_2;
  uint uVar20;
  undefined8 *puVar21;
  void *pvVar22;
  long lVar23;
  size_t sVar24;
  undefined1 (*pauVar25) [16];
  undefined1 *puVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  void *pvVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  int remain_1;
  long lVar34;
  int k;
  ulong uVar35;
  float *pfVar36;
  int iVar37;
  uint uVar38;
  int g;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  void *pvVar42;
  bool bVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  __m128 pos;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar105;
  float fVar106;
  __m128 pos_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar108;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar79;
  undefined1 auVar91 [16];
  float fVar107;
  float fVar109;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  __m128 max;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  long local_2d0;
  Mat scales;
  byte local_278;
  Mat top_blob_unpacked;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> requantize_scales;
  _Vector_base<float,_std::allocator<float>_> local_160;
  _Vector_base<float,_std::allocator<float>_> local_148;
  _Vector_base<float,_std::allocator<float>_> local_130;
  _Vector_base<float,_std::allocator<float>_> local_118;
  Mat bottom_blob_int8;
  Option opt_g;
  Mat top_blob_g;
  
  iVar37 = bottom_blob->elempack;
  iVar14 = bottom_blob->c;
  if (iVar37 == 0) {
    bVar43 = false;
  }
  else {
    bVar43 = ((int)bottom_blob->elemsize << 3) / iVar37 == 8;
  }
  p_Var12 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var12);
  iVar9 = *(int *)(&this->field_0xdc + (long)p_Var12);
  iVar28 = *(int *)(&this->field_0xd8 + (long)p_Var12);
  iVar2 = *(int *)(&this->field_0xe0 + (long)p_Var12);
  Mat::Mat(&bottom_blob_int8,bottom_blob);
  if (!bVar43) {
    iVar37 = iVar37 * iVar14;
    iVar14 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
    uVar39 = 0;
    Mat::Mat(&scales,iVar37,4,(Allocator *)0x0);
    uVar40 = (long)iVar37 / (long)iVar14;
    pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
    uVar41 = uVar40 & 0xffffffff;
    puVar15 = (undefined4 *)scales.data;
    if ((int)uVar40 < 1) {
      uVar41 = uVar39;
    }
    for (; (long)uVar39 < (long)*(int *)(&this->field_0x108 + (long)pp_Var11[-3]);
        uVar39 = uVar39 + 1) {
      uVar3 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)pp_Var11[-3]) + uVar39 * 4);
      uVar40 = uVar41;
      while (iVar37 = (int)uVar40, uVar40 = (ulong)(iVar37 - 1), iVar37 != 0) {
        *puVar15 = uVar3;
        puVar15 = puVar15 + 1;
      }
    }
    top_blob_unpacked.data = *(void **)opt;
    top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
    top_blob_unpacked.elempack = opt->openmp_blocktime;
    top_blob_unpacked._28_1_ = opt->use_winograd_convolution;
    top_blob_unpacked._29_1_ = opt->use_sgemm_convolution;
    top_blob_unpacked._30_1_ = opt->use_int8_inference;
    top_blob_unpacked._31_1_ = opt->use_vulkan_compute;
    top_blob_unpacked.allocator._0_1_ = opt->use_bf16_storage;
    top_blob_unpacked.allocator._1_1_ = opt->use_fp16_packed;
    top_blob_unpacked.allocator._2_1_ = opt->use_fp16_storage;
    top_blob_unpacked.allocator._3_1_ = opt->use_fp16_arithmetic;
    top_blob_unpacked.allocator._4_1_ = opt->use_int8_packed;
    top_blob_unpacked.allocator._5_1_ = opt->use_int8_storage;
    top_blob_unpacked.allocator._6_1_ = opt->use_int8_arithmetic;
    top_blob_unpacked.allocator._7_1_ = opt->use_packing_layout;
    top_blob_unpacked.dims._0_1_ = opt->use_shader_pack8;
    top_blob_unpacked.dims._1_1_ = opt->use_subgroup_basic;
    top_blob_unpacked.dims._2_1_ = opt->use_subgroup_vote;
    top_blob_unpacked.dims._3_1_ = opt->use_subgroup_ballot;
    top_blob_unpacked.w._0_1_ = opt->use_subgroup_shuffle;
    top_blob_unpacked.w._1_1_ = opt->use_image_storage;
    top_blob_unpacked.w._2_1_ = opt->use_tensor_storage;
    top_blob_unpacked.w._3_1_ = opt->use_weight_fp16_storage;
    top_blob_unpacked.h = opt->flush_denormals;
    top_blob_unpacked.d._0_1_ = opt->use_local_pool_allocator;
    top_blob_unpacked.d._1_1_ = opt->use_reserved_1;
    top_blob_unpacked.d._2_1_ = opt->use_reserved_2;
    top_blob_unpacked.d._3_1_ = opt->use_reserved_3;
    top_blob_unpacked.c._0_1_ = opt->use_reserved_4;
    top_blob_unpacked.c._1_1_ = opt->use_reserved_5;
    top_blob_unpacked.c._2_1_ = opt->use_reserved_6;
    top_blob_unpacked.c._3_1_ = opt->use_reserved_7;
    top_blob_unpacked._60_1_ = opt->use_reserved_8;
    top_blob_unpacked._61_1_ = opt->use_reserved_9;
    top_blob_unpacked._62_1_ = opt->use_reserved_10;
    top_blob_unpacked._63_1_ = opt->use_reserved_11;
    top_blob_unpacked.refcount = (int *)opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&bottom_blob_int8,&scales,(Option *)&top_blob_unpacked);
    Mat::~Mat(&scales);
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]),&bottom_blob_int8,
             &bottom_blob_bordered,opt);
  uVar38 = bottom_blob_bordered.c;
  iVar7 = bottom_blob_bordered.w;
  iVar14 = bottom_blob_bordered.elempack;
  iVar37 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (bottom_blob_bordered.cstep * (long)bottom_blob_bordered.c == 0)) goto LAB_0026207b;
  p_Var12 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar27 = (~((iVar18 + -1) * iVar9) + bottom_blob_bordered.w) /
           *(int *)(&this->field_0xe4 + (long)p_Var12);
  iVar18 = (~((iVar28 + -1) * iVar2) + bottom_blob_bordered.h) /
           *(int *)(&this->field_0xe8 + (long)p_Var12);
  iVar28 = iVar27 + 1;
  iVar9 = iVar18 + 1;
  uVar20 = bottom_blob_bordered.elempack * bottom_blob_bordered.c;
  if ((uVar20 == *(uint *)(&this->field_0x108 + (long)p_Var12)) &&
     (uVar20 == *(uint *)(&this->field_0xd0 + (long)p_Var12))) {
    uVar19 = 8;
    if (opt->use_packing_layout == false) {
      uVar19 = 1;
    }
    if ((uVar20 & 7) != 0) {
      uVar19 = 1;
    }
    iVar2 = *(int *)(&this->field_0x10c + (long)p_Var12);
    uVar10 = uVar19 * 4;
    if (100 < iVar2) {
      uVar10 = uVar19;
    }
    Mat::create(top_blob,iVar28,iVar9,(int)uVar20 / (int)uVar19,(ulong)uVar10,uVar19,
                opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0026207b;
    iVar37 = 0;
    if (iVar14 == 1) {
      pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var12 = pp_Var11[-3];
      iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var12);
      if (iVar37 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var12) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var12) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var12) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var12) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var12) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var12) < 2)))) {
          if (iVar2 < 0x65) {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (lVar33 = 0; p_Var12 = pp_Var11[-3],
                lVar33 < *(int *)(&this->field_0x108 + (long)p_Var12); lVar33 = lVar33 + 1) {
              scales.data = (void *)CONCAT44(scales.data._4_4_,
                                             1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                        (long)p_Var12) + lVar33 * 4)
                                                   * *(float *)(*(long *)(&this->field_0x240 +
                                                                         (long)p_Var12) + lVar33 * 4
                                                               )));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict *)&scales);
              pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_130,&requantize_scales);
            lVar16 = (long)bottom_blob_bordered.w;
            iVar37 = top_blob->w;
            iVar14 = top_blob->h;
            lVar33 = *(long *)(&this->field_0x168 + (long)p_Var12);
            lVar34 = *(long *)(&this->field_0x1b0 + (long)p_Var12);
            uVar40 = 0;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            uVar41 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar41 = uVar40;
            }
            for (; uVar40 != uVar41; uVar40 = uVar40 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar40);
              pvVar42 = scales.data;
              if (lVar34 == 0) {
                fVar79 = 0.0;
              }
              else {
                fVar79 = *(float *)(lVar34 + uVar40 * 4);
              }
              fVar44 = local_130._M_impl.super__Vector_impl_data._M_start[uVar40];
              Mat::fill(&scales,fVar79);
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar40);
              pvVar22 = top_blob_unpacked.data;
              lVar23 = uVar40 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar13 = lVar16 + (long)pvVar22;
              pvVar17 = (void *)(lVar16 * 2 + (long)pvVar22);
              for (iVar18 = 0; iVar18 != iVar14; iVar18 = iVar18 + 1) {
                lVar31 = 0;
                pvVar30 = pvVar42;
                for (iVar9 = iVar37; 0 < iVar9; iVar9 = iVar9 + -1) {
                  *(float *)((long)pvVar42 + lVar31 * 4) =
                       fVar44 * (float)((int)*(char *)(lVar33 + 8 + lVar23) *
                                        (int)*(char *)((long)pvVar17 + lVar31 + 2) +
                                        (int)*(char *)(lVar33 + 7 + lVar23) *
                                        (int)*(char *)((long)pvVar17 + lVar31 + 1) +
                                       (int)*(char *)(lVar33 + 6 + lVar23) *
                                       (int)*(char *)((long)pvVar17 + lVar31) +
                                       (int)*(char *)(lVar33 + 5 + lVar23) *
                                       (int)*(char *)(lVar13 + 2 + lVar31) +
                                       (int)*(char *)(lVar33 + 4 + lVar23) *
                                       (int)*(char *)(lVar13 + 1 + lVar31) +
                                       (int)*(char *)(lVar33 + 3 + lVar23) *
                                       (int)*(char *)(lVar13 + lVar31) +
                                       (int)*(char *)(lVar33 + 2 + lVar23) *
                                       (int)*(char *)((long)pvVar22 + lVar31 + 2) +
                                       (int)*(char *)(lVar33 + 1 + lVar23) *
                                       (int)*(char *)((long)pvVar22 + lVar31 + 1) +
                                       (int)*(char *)(lVar33 + lVar23) *
                                       (int)*(char *)((long)pvVar22 + lVar31)) +
                       *(float *)((long)pvVar42 + lVar31 * 4);
                  pvVar30 = (void *)((long)pvVar30 + 4);
                  lVar31 = lVar31 + 1;
                }
                pvVar22 = (void *)((long)pvVar22 + lVar31 + 2);
                lVar13 = lVar13 + lVar31 + 2;
                pvVar17 = (void *)((long)pvVar17 + lVar31 + 2);
                pvVar42 = pvVar30;
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_130;
LAB_00263c8d:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
          }
          else {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (lVar33 = 0; p_Var12 = pp_Var11[-3],
                lVar33 < *(int *)(&this->field_0x108 + (long)p_Var12); lVar33 = lVar33 + 1) {
              fVar79 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var12) + lVar33 * 4);
              fVar44 = 0.0;
              if (fVar79 != 0.0) {
                fVar44 = 1.0 / (fVar79 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var12) +
                                                   lVar33 * 4));
              }
              scales.data = (void *)CONCAT44(scales.data._4_4_,fVar44);
              top_blob_unpacked.data =
                   (void *)CONCAT44(top_blob_unpacked.data._4_4_,
                                    *(undefined4 *)
                                     (*(long *)(&this->field_0x288 + (long)p_Var12) + lVar33 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict *)&scales);
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict *)&top_blob_unpacked);
              pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_118,&requantize_scales);
            lVar16 = (long)bottom_blob_bordered.w;
            iVar37 = top_blob->w;
            iVar14 = top_blob->h;
            lVar33 = *(long *)(&this->field_0x168 + (long)p_Var12);
            lVar34 = *(long *)(&this->field_0x1b0 + (long)p_Var12);
            uVar40 = 0;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            uVar41 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar41 = uVar40;
            }
            for (; uVar40 != uVar41; uVar40 = uVar40 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar40);
              pvVar42 = scales.data;
              if (lVar34 == 0) {
                fVar79 = 0.0;
              }
              else {
                fVar79 = *(float *)(lVar34 + uVar40 * 4);
              }
              fVar44 = local_118._M_impl.super__Vector_impl_data._M_start[uVar40 * 2];
              fVar1 = local_118._M_impl.super__Vector_impl_data._M_start[uVar40 * 2 + 1];
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar40);
              pvVar22 = top_blob_unpacked.data;
              lVar23 = uVar40 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar13 = lVar16 + (long)pvVar22;
              pvVar17 = (void *)(lVar16 * 2 + (long)pvVar22);
              auVar120._8_4_ = 0x80000000;
              auVar120._0_8_ = 0x8000000080000000;
              auVar120._12_4_ = 0x80000000;
              auVar114._8_4_ = 0x3effffff;
              auVar114._0_8_ = 0x3effffff3effffff;
              auVar114._12_4_ = 0x3effffff;
              for (iVar18 = 0; iVar18 != iVar14; iVar18 = iVar18 + 1) {
                lVar31 = 0;
                for (iVar9 = iVar37; 0 < iVar9; iVar9 = iVar9 + -1) {
                  fVar107 = (fVar44 * (float)((int)*(char *)(lVar33 + 8 + lVar23) *
                                              (int)*(char *)((long)pvVar17 + lVar31 + 2) +
                                              (int)*(char *)(lVar33 + 7 + lVar23) *
                                              (int)*(char *)((long)pvVar17 + lVar31 + 1) +
                                             (int)*(char *)(lVar33 + 6 + lVar23) *
                                             (int)*(char *)((long)pvVar17 + lVar31) +
                                             (int)*(char *)(lVar33 + 5 + lVar23) *
                                             (int)*(char *)(lVar13 + 2 + lVar31) +
                                             (int)*(char *)(lVar33 + 4 + lVar23) *
                                             (int)*(char *)(lVar13 + 1 + lVar31) +
                                             (int)*(char *)(lVar33 + 3 + lVar23) *
                                             (int)*(char *)(lVar13 + lVar31) +
                                             (int)*(char *)(lVar33 + 2 + lVar23) *
                                             (int)*(char *)((long)pvVar22 + lVar31 + 2) +
                                             (int)*(char *)(lVar33 + 1 + lVar23) *
                                             (int)*(char *)((long)pvVar22 + lVar31 + 1) +
                                             (int)*(char *)(lVar33 + lVar23) *
                                             (int)*(char *)((long)pvVar22 + lVar31)) + fVar79) *
                            fVar1;
                  auVar97 = vandps_avx(ZEXT416((uint)fVar107),auVar120);
                  auVar97 = vorps_avx(auVar97,auVar114);
                  auVar97 = ZEXT416((uint)(fVar107 + auVar97._0_4_));
                  auVar97 = vroundss_avx(auVar97,auVar97,0xb);
                  iVar28 = (int)auVar97._0_4_;
                  if (iVar28 < -0x7e) {
                    iVar28 = -0x7f;
                  }
                  if (0x7e < iVar28) {
                    iVar28 = 0x7f;
                  }
                  *(char *)((long)pvVar42 + lVar31) = (char)iVar28;
                  lVar31 = lVar31 + 1;
                }
                pvVar22 = (void *)((long)pvVar22 + lVar31 + 2);
                lVar13 = lVar13 + lVar31 + 2;
                pvVar17 = (void *)((long)pvVar17 + lVar31 + 2);
                pvVar42 = (void *)((long)pvVar42 + lVar31);
              }
              Mat::~Mat(&scales);
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_118);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
          }
          iVar37 = 0;
          pLVar4 = this->activation;
          if (pLVar4 != (Layer *)0x0) {
            (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
          }
          goto LAB_0026207b;
        }
        iVar37 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var12) == 1) &&
             ((*(int *)(&this->field_0xe0 + (long)p_Var12) == 1 &&
              (*(int *)(&this->field_0xe4 + (long)p_Var12) == 2)))) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var12) == 2)) &&
           (*(uint *)(&this->field_0x110 + (long)p_Var12) < 2)) {
          if (iVar2 < 0x65) {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (lVar33 = 0; p_Var12 = pp_Var11[-3],
                lVar33 < *(int *)(&this->field_0x108 + (long)p_Var12); lVar33 = lVar33 + 1) {
              scales.data = (void *)CONCAT44(scales.data._4_4_,
                                             1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                        (long)p_Var12) + lVar33 * 4)
                                                   * *(float *)(*(long *)(&this->field_0x240 +
                                                                         (long)p_Var12) + lVar33 * 4
                                                               )));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict *)&scales);
              pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_160,&requantize_scales);
            lVar16 = (long)bottom_blob_bordered.w;
            iVar37 = top_blob->w;
            lVar33 = *(long *)(&this->field_0x168 + (long)p_Var12);
            lVar34 = *(long *)(&this->field_0x1b0 + (long)p_Var12);
            lVar23 = (long)((bottom_blob_bordered.w - iVar37) * 2);
            uVar40 = 0;
            uVar38 = top_blob->h;
            if (top_blob->h < 1) {
              uVar38 = 0;
            }
            uVar20 = top_blob->c;
            if (top_blob->c < 1) {
              uVar20 = 0;
            }
            for (; uVar40 != uVar20; uVar40 = uVar40 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar40);
              pfVar36 = (float *)scales.data;
              if (lVar34 == 0) {
                fVar79 = 0.0;
              }
              else {
                fVar79 = *(float *)(lVar34 + uVar40 * 4);
              }
              fVar44 = local_160._M_impl.super__Vector_impl_data._M_start[uVar40];
              Mat::fill(&scales,fVar79);
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar40);
              pvVar42 = top_blob_unpacked.data;
              lVar13 = uVar40 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar31 = lVar16 + (long)pvVar42;
              pvVar22 = (void *)(lVar16 * 2 + (long)pvVar42);
              for (uVar19 = 0; uVar19 != uVar38; uVar19 = uVar19 + 1) {
                lVar32 = 0;
                for (iVar14 = iVar37; 0 < iVar14; iVar14 = iVar14 + -1) {
                  *pfVar36 = fVar44 * (float)((int)*(char *)(lVar33 + 8 + lVar13) *
                                              (int)*(char *)((long)pvVar22 + lVar32 + 2) +
                                              (int)*(char *)(lVar33 + 7 + lVar13) *
                                              (int)*(char *)((long)pvVar22 + lVar32 + 1) +
                                             (int)*(char *)(lVar33 + 6 + lVar13) *
                                             (int)*(char *)((long)pvVar22 + lVar32) +
                                             (int)*(char *)(lVar33 + 5 + lVar13) *
                                             (int)*(char *)(lVar31 + 2 + lVar32) +
                                             (int)*(char *)(lVar33 + 4 + lVar13) *
                                             (int)*(char *)(lVar31 + 1 + lVar32) +
                                             (int)*(char *)(lVar33 + 3 + lVar13) *
                                             (int)*(char *)(lVar31 + lVar32) +
                                             (int)*(char *)(lVar33 + 2 + lVar13) *
                                             (int)*(char *)((long)pvVar42 + lVar32 + 2) +
                                             (int)*(char *)(lVar33 + 1 + lVar13) *
                                             (int)*(char *)((long)pvVar42 + lVar32 + 1) +
                                             (int)*(char *)(lVar33 + lVar13) *
                                             (int)*(char *)((long)pvVar42 + lVar32)) + *pfVar36;
                  pfVar36 = pfVar36 + 1;
                  lVar32 = lVar32 + 2;
                }
                pvVar42 = (void *)((long)pvVar42 + lVar32 + lVar23);
                lVar31 = lVar31 + lVar23 + lVar32;
                pvVar22 = (void *)((long)pvVar22 + lVar32 + lVar23);
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_160;
          }
          else {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (lVar33 = 0; p_Var12 = pp_Var11[-3],
                lVar33 < *(int *)(&this->field_0x108 + (long)p_Var12); lVar33 = lVar33 + 1) {
              fVar79 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var12) + lVar33 * 4);
              fVar44 = 0.0;
              if (fVar79 != 0.0) {
                fVar44 = 1.0 / (fVar79 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var12) +
                                                   lVar33 * 4));
              }
              scales.data = (void *)CONCAT44(scales.data._4_4_,fVar44);
              top_blob_unpacked.data =
                   (void *)CONCAT44(top_blob_unpacked.data._4_4_,
                                    *(undefined4 *)
                                     (*(long *)(&this->field_0x288 + (long)p_Var12) + lVar33 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict *)&scales);
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict *)&top_blob_unpacked);
              pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_148,&requantize_scales);
            lVar16 = (long)bottom_blob_bordered.w;
            iVar37 = top_blob->w;
            lVar33 = *(long *)(&this->field_0x168 + (long)p_Var12);
            lVar34 = *(long *)(&this->field_0x1b0 + (long)p_Var12);
            uVar40 = 0;
            iVar14 = top_blob->h;
            if (top_blob->h < 1) {
              iVar14 = 0;
            }
            lVar23 = (long)((bottom_blob_bordered.w - iVar37) * 2);
            uVar41 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar41 = uVar40;
            }
            for (; uVar40 != uVar41; uVar40 = uVar40 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar40);
              puVar26 = (undefined1 *)scales.data;
              if (lVar34 == 0) {
                fVar79 = 0.0;
              }
              else {
                fVar79 = *(float *)(lVar34 + uVar40 * 4);
              }
              fVar44 = local_148._M_impl.super__Vector_impl_data._M_start[uVar40 * 2];
              fVar1 = local_148._M_impl.super__Vector_impl_data._M_start[uVar40 * 2 + 1];
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar40);
              pvVar42 = top_blob_unpacked.data;
              lVar13 = uVar40 * 9;
              Mat::~Mat(&top_blob_unpacked);
              lVar31 = lVar16 + (long)pvVar42;
              pvVar22 = (void *)(lVar16 * 2 + (long)pvVar42);
              auVar97._8_4_ = 0x80000000;
              auVar97._0_8_ = 0x8000000080000000;
              auVar97._12_4_ = 0x80000000;
              auVar84._8_4_ = 0x3effffff;
              auVar84._0_8_ = 0x3effffff3effffff;
              auVar84._12_4_ = 0x3effffff;
              for (iVar18 = 0; iVar18 != iVar14; iVar18 = iVar18 + 1) {
                lVar32 = 0;
                for (iVar9 = iVar37; 0 < iVar9; iVar9 = iVar9 + -1) {
                  fVar107 = (fVar44 * (float)((int)*(char *)(lVar33 + 8 + lVar13) *
                                              (int)*(char *)((long)pvVar22 + lVar32 + 2) +
                                              (int)*(char *)(lVar33 + 7 + lVar13) *
                                              (int)*(char *)((long)pvVar22 + lVar32 + 1) +
                                             (int)*(char *)(lVar33 + 6 + lVar13) *
                                             (int)*(char *)((long)pvVar22 + lVar32) +
                                             (int)*(char *)(lVar33 + 5 + lVar13) *
                                             (int)*(char *)(lVar31 + 2 + lVar32) +
                                             (int)*(char *)(lVar33 + 4 + lVar13) *
                                             (int)*(char *)(lVar31 + 1 + lVar32) +
                                             (int)*(char *)(lVar33 + 3 + lVar13) *
                                             (int)*(char *)(lVar31 + lVar32) +
                                             (int)*(char *)(lVar33 + 2 + lVar13) *
                                             (int)*(char *)((long)pvVar42 + lVar32 + 2) +
                                             (int)*(char *)(lVar33 + 1 + lVar13) *
                                             (int)*(char *)((long)pvVar42 + lVar32 + 1) +
                                             (int)*(char *)(lVar33 + lVar13) *
                                             (int)*(char *)((long)pvVar42 + lVar32)) + fVar79) *
                            fVar1;
                  auVar120 = vandps_avx(ZEXT416((uint)fVar107),auVar97);
                  auVar120 = vorps_avx(auVar120,auVar84);
                  auVar120 = ZEXT416((uint)(fVar107 + auVar120._0_4_));
                  auVar120 = vroundss_avx(auVar120,auVar120,0xb);
                  iVar28 = (int)auVar120._0_4_;
                  if (iVar28 < -0x7e) {
                    iVar28 = -0x7f;
                  }
                  if (0x7e < iVar28) {
                    iVar28 = 0x7f;
                  }
                  *puVar26 = (char)iVar28;
                  puVar26 = puVar26 + 1;
                  lVar32 = lVar32 + 2;
                }
                pvVar42 = (void *)((long)pvVar42 + lVar32 + lVar23);
                lVar31 = lVar31 + lVar23 + lVar32;
                pvVar22 = (void *)((long)pvVar22 + lVar32 + lVar23);
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_148;
          }
          goto LAB_00263c8d;
        }
      }
      uVar38 = iVar37 * *(int *)(&this->field_0xd4 + (long)p_Var12);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&top_blob_unpacked,(long)(int)uVar38,
                 (allocator_type *)&scales);
      pvVar42 = top_blob_unpacked.data;
      pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var12 = pp_Var11[-3];
      iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var12);
      iVar14 = *(int *)(&this->field_0xdc + (long)p_Var12);
      iVar9 = *(int *)(&this->field_0xd4 + (long)p_Var12);
      lVar33 = 0;
      iVar28 = 0;
      for (iVar29 = 0; iVar29 < *(int *)(&this->field_0xd8 + (long)p_Var12); iVar29 = iVar29 + 1) {
        for (lVar34 = 0; (int)lVar34 < *(int *)(&this->field_0xd4 + (long)p_Var12);
            lVar34 = lVar34 + 1) {
          *(int *)((long)top_blob_unpacked.data + lVar34 * 4 + (long)(int)lVar33 * 4) = iVar28;
          p_Var12 = pp_Var11[-3];
          iVar28 = iVar28 + *(int *)(&this->field_0xdc + (long)p_Var12);
        }
        iVar28 = iVar28 + (iVar7 * iVar37 - iVar14 * iVar9);
        lVar33 = (int)lVar33 + lVar34;
      }
      local_2d0 = 0;
      uVar20 = uVar38;
      if ((int)uVar38 < 1) {
        uVar20 = 0;
      }
      for (lVar33 = 0; lVar33 < *(int *)(&this->field_0x108 + (long)p_Var12); lVar33 = lVar33 + 1) {
        iVar37 = (int)lVar33;
        Mat::channel(&scales,top_blob,iVar37);
        puVar26 = (undefined1 *)scales.data;
        Mat::~Mat(&scales);
        Mat::channel(&scales,top_blob,iVar37);
        pfVar36 = (float *)scales.data;
        Mat::~Mat(&scales);
        lVar34 = *(long *)(&this->field_0x168 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
        Mat::channel(&scales,&bottom_blob_bordered,iVar37);
        for (iVar37 = 0; iVar37 <= iVar18; iVar37 = iVar37 + 1) {
          pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
          for (iVar14 = 0; iVar14 <= iVar27; iVar14 = iVar14 + 1) {
            p_Var12 = pp_Var11[-3];
            iVar9 = 0;
            for (uVar40 = 0; uVar20 != uVar40; uVar40 = uVar40 + 1) {
              iVar9 = iVar9 + (int)*(char *)(lVar34 + local_2d0 + uVar40) *
                              (int)*(char *)((long)scales.data +
                                            (long)*(int *)((long)pvVar42 + uVar40 * 4) +
                                            (long)iVar14 *
                                            (long)*(int *)(&this->field_0xe4 + (long)p_Var12) +
                                            (long)scales.w * (long)iVar37 *
                                            (long)*(int *)(&this->field_0xe8 + (long)p_Var12) *
                                            scales.elemsize);
            }
            fVar79 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var12) + lVar33 * 4);
            fVar44 = 0.0;
            if (fVar79 != 0.0) {
              fVar44 = 1.0 / (fVar79 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var12) +
                                                 lVar33 * 4));
            }
            fVar44 = fVar44 * (float)iVar9;
            if (*(int *)(&this->field_0x100 + (long)p_Var12) != 0) {
              fVar44 = fVar44 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var12) +
                                          lVar33 * 4);
            }
            auVar97 = ZEXT416((uint)fVar44);
            fVar79 = fVar44;
            switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var12)) {
            case 1:
              auVar97 = vmaxss_avx(auVar97,ZEXT416(0));
              fVar79 = auVar97._0_4_;
              break;
            case 2:
              auVar97 = vcmpss_avx(ZEXT816(0) << 0x20,auVar97,1);
              auVar76._8_4_ = 0x3f800000;
              auVar76._0_8_ = 0x3f8000003f800000;
              auVar76._12_4_ = 0x3f800000;
              auVar97 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var12)),
                                      auVar76,auVar97);
              fVar107 = auVar97._0_4_;
LAB_002630bb:
              fVar79 = fVar107 * fVar44;
              break;
            case 3:
              auVar97 = vmaxss_avx(auVar97,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var12)))
              ;
              auVar97 = vminss_avx(auVar97,ZEXT416((*(uint **)(&this->field_0x118 + (long)p_Var12))
                                                   [1]));
              fVar79 = auVar97._0_4_;
              break;
            case 4:
              fVar79 = expf(-fVar44);
              fVar79 = 1.0 / (fVar79 + 1.0);
              break;
            case 5:
              fVar79 = expf(fVar44);
              fVar79 = logf(fVar79 + 1.0);
              fVar79 = tanhf(fVar79);
              fVar79 = fVar79 * fVar44;
              break;
            case 6:
              fVar1 = **(float **)(&this->field_0x118 + (long)p_Var12);
              fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var12))[1];
              fVar109 = -fVar107 / fVar1;
              fVar79 = 0.0;
              if ((fVar109 <= fVar44) && (fVar79 = fVar44, fVar44 <= fVar109 + 1.0 / fVar1)) {
                fVar107 = fVar1 * fVar44 + fVar107;
                goto LAB_002630bb;
              }
            }
            if (iVar2 < 0x65) {
              *pfVar36 = fVar79;
              pfVar36 = pfVar36 + 1;
            }
            else {
              fVar79 = fVar79 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var12) +
                                          lVar33 * 4);
              auVar62._8_4_ = 0x80000000;
              auVar62._0_8_ = 0x8000000080000000;
              auVar62._12_4_ = 0x80000000;
              auVar97 = vandps_avx(ZEXT416((uint)fVar79),auVar62);
              auVar77._8_4_ = 0x3effffff;
              auVar77._0_8_ = 0x3effffff3effffff;
              auVar77._12_4_ = 0x3effffff;
              auVar97 = vorps_avx(auVar97,auVar77);
              auVar97 = ZEXT416((uint)(fVar79 + auVar97._0_4_));
              auVar97 = vroundss_avx(auVar97,auVar97,0xb);
              iVar9 = (int)auVar97._0_4_;
              if (iVar9 < -0x7e) {
                iVar9 = -0x7f;
              }
              uVar8 = (undefined1)iVar9;
              if (0x7e < iVar9) {
                uVar8 = 0x7f;
              }
              *puVar26 = uVar8;
              puVar26 = puVar26 + 1;
            }
          }
        }
        Mat::~Mat(&scales);
        p_Var12 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
        local_2d0 = local_2d0 + (int)uVar38;
      }
    }
    else {
      if (iVar14 != 8) goto LAB_0026207b;
      uVar40 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             );
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&top_blob_unpacked,uVar40,
                 (allocator_type *)&scales);
      pvVar42 = top_blob_unpacked.data;
      pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var12 = pp_Var11[-3];
      iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var12);
      iVar14 = *(int *)(&this->field_0xdc + (long)p_Var12);
      iVar9 = *(int *)(&this->field_0xd4 + (long)p_Var12);
      iVar29 = 0;
      lVar33 = 0;
      for (iVar28 = 0; iVar28 < *(int *)(&this->field_0xd8 + (long)p_Var12); iVar28 = iVar28 + 1) {
        for (lVar34 = 0; (int)lVar34 < *(int *)(&this->field_0xd4 + (long)p_Var12);
            lVar34 = lVar34 + 1) {
          *(int *)((long)top_blob_unpacked.data + lVar34 * 4 + (long)(int)lVar33 * 4) = iVar29;
          p_Var12 = pp_Var11[-3];
          iVar29 = iVar29 + *(int *)(&this->field_0xdc + (long)p_Var12);
        }
        iVar29 = iVar29 + (iVar7 * iVar37 - iVar14 * iVar9);
        lVar33 = (int)lVar33 + lVar34;
      }
      uVar41 = uVar40 & 0xffffffff;
      if ((int)uVar40 < 1) {
        uVar41 = 0;
      }
      iVar37 = 0;
      if ((int)uVar38 < 1) {
        uVar38 = 0;
      }
      for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
        iVar14 = (int)uVar39;
        Mat::channel(&scales,top_blob,iVar14);
        puVar21 = (undefined8 *)scales.data;
        Mat::~Mat(&scales);
        Mat::channel(&scales,top_blob,iVar14);
        pauVar25 = (undefined1 (*) [16])scales.data;
        Mat::~Mat(&scales);
        pvVar22 = (this->weight_data_int8).data;
        Mat::channel(&scales,&bottom_blob_bordered,iVar14);
        for (iVar14 = 0; iVar14 <= iVar18; iVar14 = iVar14 + 1) {
          pp_Var11 = this->_vptr_ConvolutionDepthWise_x86_avx;
          for (iVar9 = 0; iVar9 <= iVar27; iVar9 = iVar9 + 1) {
            p_Var12 = pp_Var11[-3];
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            uVar35 = 0;
            auVar63 = ZEXT1664((undefined1  [16])0x0);
            while( true ) {
              if (uVar41 == uVar35) break;
              auVar64._8_8_ = 0;
              auVar64._0_8_ =
                   *(ulong *)((long)scales.data +
                             (long)*(int *)((long)pvVar42 + uVar35 * 4) * 8 +
                             (long)(*(int *)(&this->field_0xe4 + (long)p_Var12) * iVar9 * 8) +
                             (long)scales.w * (long)iVar14 *
                             (long)*(int *)(&this->field_0xe8 + (long)p_Var12) * scales.elemsize);
              auVar97 = vpcmpgtb_avx((undefined1  [16])0x0,auVar64);
              auVar120 = vpunpcklbw_avx(auVar64,auVar97);
              auVar80._8_8_ = 0;
              auVar80._0_8_ = *(ulong *)((long)pvVar22 + uVar35 * 8 + (long)iVar37);
              auVar97 = vpcmpgtb_avx((undefined1  [16])0x0,auVar80);
              auVar97 = vpunpcklbw_avx(auVar80,auVar97);
              auVar84 = vpmullw_avx(auVar97,auVar120);
              auVar97 = vpmulhw_avx(auVar120,auVar97);
              auVar120 = vpunpcklwd_avx(auVar84,auVar97);
              auVar84 = vpunpckhwd_avx(auVar84,auVar97);
              auVar97 = vpaddd_avx(auVar63._0_16_,auVar120);
              auVar63 = ZEXT1664(auVar97);
              auVar97 = vpaddd_avx(auVar51._0_16_,auVar84);
              auVar51 = ZEXT1664(auVar97);
              uVar35 = uVar35 + 1;
            }
            auVar97 = *(undefined1 (*) [16])
                       (*(long *)(&this->field_0x1f8 + (long)p_Var12) + uVar39 * 0x20);
            auVar84 = *(undefined1 (*) [16])
                       (*(long *)(&this->field_0x1f8 + (long)p_Var12) + 0x10 + uVar39 * 0x20);
            pfVar36 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var12) + uVar39 * 0x20);
            auVar110._0_4_ = auVar97._0_4_ * *pfVar36;
            auVar110._4_4_ = auVar97._4_4_ * pfVar36[1];
            auVar110._8_4_ = auVar97._8_4_ * pfVar36[2];
            auVar110._12_4_ = auVar97._12_4_ * pfVar36[3];
            pfVar36 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var12) + 0x10 + uVar39 * 0x20
                               );
            auVar126._0_4_ = auVar84._0_4_ * *pfVar36;
            auVar126._4_4_ = auVar84._4_4_ * pfVar36[1];
            auVar126._8_4_ = auVar84._8_4_ * pfVar36[2];
            auVar126._12_4_ = auVar84._12_4_ * pfVar36[3];
            auVar120 = vrcpps_avx(auVar110);
            auVar114 = vrcpps_avx(auVar126);
            auVar97 = vcmpps_avx(auVar97,ZEXT816(0) << 0x40,4);
            auVar97 = vandps_avx(auVar97,auVar120);
            auVar84 = vcmpps_avx(auVar84,ZEXT816(0) << 0x40,4);
            auVar84 = vandps_avx(auVar84,auVar114);
            auVar120 = vcvtdq2ps_avx(auVar63._0_16_);
            auVar65._0_4_ = auVar97._0_4_ * auVar120._0_4_;
            auVar65._4_4_ = auVar97._4_4_ * auVar120._4_4_;
            auVar65._8_4_ = auVar97._8_4_ * auVar120._8_4_;
            auVar65._12_4_ = auVar97._12_4_ * auVar120._12_4_;
            auVar97 = vcvtdq2ps_avx(auVar51._0_16_);
            auVar45._0_4_ = auVar84._0_4_ * auVar97._0_4_;
            auVar45._4_4_ = auVar84._4_4_ * auVar97._4_4_;
            auVar45._8_4_ = auVar84._8_4_ * auVar97._8_4_;
            auVar45._12_4_ = auVar84._12_4_ * auVar97._12_4_;
            if (*(int *)(&this->field_0x100 + (long)p_Var12) != 0) {
              pfVar36 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var12) + uVar39 * 0x20);
              auVar65._0_4_ = auVar65._0_4_ + *pfVar36;
              auVar65._4_4_ = auVar65._4_4_ + pfVar36[1];
              auVar65._8_4_ = auVar65._8_4_ + pfVar36[2];
              auVar65._12_4_ = auVar65._12_4_ + pfVar36[3];
              pfVar36 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var12) + 0x10 +
                                 uVar39 * 0x20);
              auVar45._0_4_ = auVar45._0_4_ + *pfVar36;
              auVar45._4_4_ = auVar45._4_4_ + pfVar36[1];
              auVar45._8_4_ = auVar45._8_4_ + pfVar36[2];
              auVar45._12_4_ = auVar45._12_4_ + pfVar36[3];
            }
            auVar55 = auVar65;
            auVar103 = auVar45;
            if (5 < *(int *)(&this->field_0x110 + (long)p_Var12) - 1U)
            goto switchD_002623ec_caseD_1;
            auVar97 = ZEXT816(0) << 0x40;
            auVar55 = vmaxps_avx(auVar65,auVar97);
            auVar103 = vmaxps_avx(auVar45,auVar97);
            fVar79 = auVar65._0_4_;
            fVar44 = auVar65._4_4_;
            fVar107 = auVar65._8_4_;
            fVar109 = auVar65._12_4_;
            fVar1 = auVar45._8_4_;
            fVar5 = auVar45._12_4_;
            switch(*(int *)(&this->field_0x110 + (long)p_Var12)) {
            case 2:
              auVar84 = vminps_avx(auVar65,auVar97);
              fVar79 = **(float **)(&this->field_0x118 + (long)p_Var12);
              auVar52._0_4_ = fVar79 * auVar84._0_4_ + auVar55._0_4_;
              auVar52._4_4_ = fVar79 * auVar84._4_4_ + auVar55._4_4_;
              auVar52._8_4_ = fVar79 * auVar84._8_4_ + auVar55._8_4_;
              auVar52._12_4_ = fVar79 * auVar84._12_4_ + auVar55._12_4_;
              auVar97 = vminps_avx(auVar45,auVar97);
              auVar81._0_4_ = fVar79 * auVar97._0_4_ + auVar103._0_4_;
              auVar81._4_4_ = fVar79 * auVar97._4_4_ + auVar103._4_4_;
              auVar81._8_4_ = fVar79 * auVar97._8_4_ + auVar103._8_4_;
              auVar81._12_4_ = fVar79 * auVar97._12_4_ + auVar103._12_4_;
              auVar55 = auVar52;
              auVar103 = auVar81;
              break;
            case 3:
              uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var12);
              auVar98._4_4_ = uVar3;
              auVar98._0_4_ = uVar3;
              auVar98._8_4_ = uVar3;
              auVar98._12_4_ = uVar3;
              uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var12))[1];
              auVar124._4_4_ = uVar3;
              auVar124._0_4_ = uVar3;
              auVar124._8_4_ = uVar3;
              auVar124._12_4_ = uVar3;
              auVar97 = vmaxps_avx(auVar65,auVar98);
              auVar55 = vminps_avx(auVar97,auVar124);
              auVar97 = vmaxps_avx(auVar45,auVar98);
              auVar103 = vminps_avx(auVar97,auVar124);
              break;
            case 4:
              auVar56._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
              auVar56._8_4_ = -fVar107;
              auVar56._12_4_ = -fVar109;
              auVar137._8_4_ = 0x42b0c0a5;
              auVar137._0_8_ = 0x42b0c0a542b0c0a5;
              auVar137._12_4_ = 0x42b0c0a5;
              auVar97 = vminps_avx(auVar56,auVar137);
              auVar139._8_4_ = 0xc2b0c0a5;
              auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar139._12_4_ = 0xc2b0c0a5;
              auVar120 = vmaxps_avx(auVar139,auVar97);
              auVar70._0_4_ = auVar120._0_4_ * 1.442695 + 0.5;
              auVar70._4_4_ = auVar120._4_4_ * 1.442695 + 0.5;
              auVar70._8_4_ = auVar120._8_4_ * 1.442695 + 0.5;
              auVar70._12_4_ = auVar120._12_4_ * 1.442695 + 0.5;
              auVar99._0_4_ = (int)auVar70._0_4_;
              auVar99._4_4_ = (int)auVar70._4_4_;
              auVar99._8_4_ = (int)auVar70._8_4_;
              auVar99._12_4_ = (int)auVar70._12_4_;
              auVar84 = vcvtdq2ps_avx(auVar99);
              auVar97 = vcmpps_avx(auVar70,auVar84,1);
              auVar142._8_4_ = 0x3f800000;
              auVar142._0_8_ = 0x3f8000003f800000;
              auVar142._12_4_ = 0x3f800000;
              auVar97 = vandps_avx(auVar142,auVar97);
              auVar97 = vsubps_avx(auVar84,auVar97);
              auVar100._0_4_ = auVar97._0_4_ * 0.6931472;
              auVar100._4_4_ = auVar97._4_4_ * 0.6931472;
              auVar100._8_4_ = auVar97._8_4_ * 0.6931472;
              auVar100._12_4_ = auVar97._12_4_ * 0.6931472;
              auVar84 = vsubps_avx(auVar120,auVar100);
              fVar79 = auVar84._0_4_;
              fVar44 = auVar84._4_4_;
              fVar107 = auVar84._8_4_;
              fVar109 = auVar84._12_4_;
              auVar71._0_4_ = (int)auVar97._0_4_;
              auVar71._4_4_ = (int)auVar97._4_4_;
              auVar71._8_4_ = (int)auVar97._8_4_;
              auVar71._12_4_ = (int)auVar97._12_4_;
              auVar97 = vpslld_avx(auVar71,0x17);
              auVar97 = vpaddd_avx(auVar142,auVar97);
              auVar57._0_4_ =
                   (fVar79 + 1.0 +
                   fVar79 * fVar79 *
                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                     0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5)) * auVar97._0_4_ + 1.0;
              auVar57._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar97._4_4_ + 1.0;
              auVar57._8_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar97._8_4_ + 1.0;
              auVar57._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar97._12_4_ + 1.0;
              auVar97 = vrcpps_avx(auVar57);
              fVar79 = auVar97._0_4_;
              auVar58._0_4_ = auVar57._0_4_ * fVar79;
              fVar44 = auVar97._4_4_;
              auVar58._4_4_ = auVar57._4_4_ * fVar44;
              fVar107 = auVar97._8_4_;
              auVar58._8_4_ = auVar57._8_4_ * fVar107;
              fVar109 = auVar97._12_4_;
              auVar58._12_4_ = auVar57._12_4_ * fVar109;
              auVar97 = vsubps_avx(auVar142,auVar58);
              auVar55._0_4_ = fVar79 + fVar79 * auVar97._0_4_;
              auVar55._4_4_ = fVar44 + fVar44 * auVar97._4_4_;
              auVar55._8_4_ = fVar107 + fVar107 * auVar97._8_4_;
              auVar55._12_4_ = fVar109 + fVar109 * auVar97._12_4_;
              auVar46._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
              auVar46._8_4_ = -fVar1;
              auVar46._12_4_ = -fVar5;
              auVar72._8_4_ = 0x42b0c0a5;
              auVar72._0_8_ = 0x42b0c0a542b0c0a5;
              auVar72._12_4_ = 0x42b0c0a5;
              auVar97 = vminps_avx(auVar46,auVar72);
              auVar120 = vmaxps_avx(auVar139,auVar97);
              auVar73._0_4_ = auVar120._0_4_ * 1.442695 + 0.5;
              auVar73._4_4_ = auVar120._4_4_ * 1.442695 + 0.5;
              auVar73._8_4_ = auVar120._8_4_ * 1.442695 + 0.5;
              auVar73._12_4_ = auVar120._12_4_ * 1.442695 + 0.5;
              auVar101._0_4_ = (int)auVar73._0_4_;
              auVar101._4_4_ = (int)auVar73._4_4_;
              auVar101._8_4_ = (int)auVar73._8_4_;
              auVar101._12_4_ = (int)auVar73._12_4_;
              auVar84 = vcvtdq2ps_avx(auVar101);
              auVar97 = vcmpps_avx(auVar73,auVar84,1);
              auVar97 = vandps_avx(auVar142,auVar97);
              auVar97 = vsubps_avx(auVar84,auVar97);
              auVar102._0_4_ = auVar97._0_4_ * 0.6931472;
              auVar102._4_4_ = auVar97._4_4_ * 0.6931472;
              auVar102._8_4_ = auVar97._8_4_ * 0.6931472;
              auVar102._12_4_ = auVar97._12_4_ * 0.6931472;
              auVar84 = vsubps_avx(auVar120,auVar102);
              fVar79 = auVar84._0_4_;
              fVar44 = auVar84._4_4_;
              fVar1 = auVar84._8_4_;
              fVar107 = auVar84._12_4_;
              auVar74._0_4_ = (int)auVar97._0_4_;
              auVar74._4_4_ = (int)auVar97._4_4_;
              auVar74._8_4_ = (int)auVar97._8_4_;
              auVar74._12_4_ = (int)auVar97._12_4_;
              auVar97 = vpslld_avx(auVar74,0x17);
              auVar97 = vpaddd_avx(auVar142,auVar97);
              auVar47._0_4_ =
                   (fVar79 + 1.0 +
                   fVar79 * fVar79 *
                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                     0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5)) * auVar97._0_4_ + 1.0;
              auVar47._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar97._4_4_ + 1.0;
              auVar47._8_4_ =
                   (fVar1 + 1.0 +
                   fVar1 * fVar1 *
                   (((((fVar1 * 0.00019875691 + 0.0013981999) * fVar1 + 0.008333452) * fVar1 +
                     0.041665796) * fVar1 + 0.16666666) * fVar1 + 0.5)) * auVar97._8_4_ + 1.0;
              auVar47._12_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar97._12_4_ + 1.0;
              auVar97 = vrcpps_avx(auVar47);
              fVar79 = auVar97._0_4_;
              auVar48._0_4_ = auVar47._0_4_ * fVar79;
              fVar44 = auVar97._4_4_;
              auVar48._4_4_ = auVar47._4_4_ * fVar44;
              fVar1 = auVar97._8_4_;
              auVar48._8_4_ = auVar47._8_4_ * fVar1;
              fVar107 = auVar97._12_4_;
              auVar48._12_4_ = auVar47._12_4_ * fVar107;
              auVar97 = vsubps_avx(auVar142,auVar48);
              auVar103._0_4_ = fVar79 + fVar79 * auVar97._0_4_;
              auVar103._4_4_ = fVar44 + fVar44 * auVar97._4_4_;
              auVar103._8_4_ = fVar1 + fVar1 * auVar97._8_4_;
              auVar103._12_4_ = fVar107 + fVar107 * auVar97._12_4_;
              break;
            case 5:
              auVar140._8_4_ = 0x42b0c0a5;
              auVar140._0_8_ = 0x42b0c0a542b0c0a5;
              auVar140._12_4_ = 0x42b0c0a5;
              auVar84 = vminps_avx(auVar140,auVar65);
              auVar141._8_4_ = 0xc2b0c0a5;
              auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar141._12_4_ = 0xc2b0c0a5;
              auVar114 = vmaxps_avx(auVar141,auVar84);
              auVar138._8_4_ = 0x3f000000;
              auVar138._0_8_ = 0x3f0000003f000000;
              auVar138._12_4_ = 0x3f000000;
              auVar82._0_4_ = auVar114._0_4_ * 1.442695 + 0.5;
              auVar82._4_4_ = auVar114._4_4_ * 1.442695 + 0.5;
              auVar82._8_4_ = auVar114._8_4_ * 1.442695 + 0.5;
              auVar82._12_4_ = auVar114._12_4_ * 1.442695 + 0.5;
              auVar111._0_4_ = (int)auVar82._0_4_;
              auVar111._4_4_ = (int)auVar82._4_4_;
              auVar111._8_4_ = (int)auVar82._8_4_;
              auVar111._12_4_ = (int)auVar82._12_4_;
              auVar120 = vcvtdq2ps_avx(auVar111);
              auVar84 = vcmpps_avx(auVar82,auVar120,1);
              auVar143._8_4_ = 0x3f800000;
              auVar143._0_8_ = 0x3f8000003f800000;
              auVar143._12_4_ = 0x3f800000;
              auVar84 = vandps_avx(auVar143,auVar84);
              auVar84 = vsubps_avx(auVar120,auVar84);
              auVar112._0_4_ = auVar84._0_4_ * 0.6931472;
              auVar112._4_4_ = auVar84._4_4_ * 0.6931472;
              auVar112._8_4_ = auVar84._8_4_ * 0.6931472;
              auVar112._12_4_ = auVar84._12_4_ * 0.6931472;
              auVar120 = vsubps_avx(auVar114,auVar112);
              fVar78 = auVar120._0_4_;
              fVar105 = auVar120._4_4_;
              fVar106 = auVar120._8_4_;
              fVar108 = auVar120._12_4_;
              auVar83._0_4_ = (int)auVar84._0_4_;
              auVar83._4_4_ = (int)auVar84._4_4_;
              auVar83._8_4_ = (int)auVar84._8_4_;
              auVar83._12_4_ = (int)auVar84._12_4_;
              auVar84 = vpslld_avx(auVar83,0x17);
              auVar84 = vpaddd_avx(auVar143,auVar84);
              auVar85._0_4_ =
                   (fVar78 + 1.0 +
                   fVar78 * fVar78 *
                   (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                     0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar84._0_4_ + 1.0;
              auVar85._4_4_ =
                   (fVar105 + 1.0 +
                   fVar105 * fVar105 *
                   (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                     0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar84._4_4_ + 1.0;
              auVar85._8_4_ =
                   (fVar106 + 1.0 +
                   fVar106 * fVar106 *
                   (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                     0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5)) * auVar84._8_4_ + 1.0;
              auVar85._12_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar84._12_4_ + 1.0;
              auVar120 = vcmpps_avx(auVar85,auVar97,2);
              auVar113._8_4_ = 0x800000;
              auVar113._0_8_ = 0x80000000800000;
              auVar113._12_4_ = 0x800000;
              auVar84 = vmaxps_avx(auVar85,auVar113);
              auVar114 = vpsrld_avx(auVar84,0x17);
              auVar127._8_4_ = 0x807fffff;
              auVar127._0_8_ = 0x807fffff807fffff;
              auVar127._12_4_ = 0x807fffff;
              auVar84 = vandps_avx(auVar84,auVar127);
              auVar62 = vorps_avx(auVar138,auVar84);
              auVar128._8_4_ = 0xffffff82;
              auVar128._0_8_ = 0xffffff82ffffff82;
              auVar128._12_4_ = 0xffffff82;
              auVar84 = vpaddd_avx(auVar114,auVar128);
              auVar76 = vcvtdq2ps_avx(auVar84);
              auVar129._8_4_ = 0x3f3504f3;
              auVar129._0_8_ = 0x3f3504f33f3504f3;
              auVar129._12_4_ = 0x3f3504f3;
              auVar114 = vcmpps_avx(auVar62,auVar129,1);
              auVar84 = vandps_avx(auVar114,auVar62);
              fVar78 = auVar62._0_4_ + -1.0 + auVar84._0_4_;
              fVar105 = auVar62._4_4_ + -1.0 + auVar84._4_4_;
              fVar106 = auVar62._8_4_ + -1.0 + auVar84._8_4_;
              fVar108 = auVar62._12_4_ + -1.0 + auVar84._12_4_;
              auVar84 = vandps_avx(auVar143,auVar114);
              auVar84 = vsubps_avx(auVar76,auVar84);
              auVar86._0_4_ =
                   (auVar84._0_4_ * 0.6931472 + fVar78 +
                   fVar78 * fVar78 *
                   (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 + 0.116769984) * fVar78 +
                         -0.12420141) * fVar78 + 0.14249323) * fVar78 + -0.16668057) * fVar78 +
                      0.20000714) * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5)) *
                   -2.0;
              auVar86._4_4_ =
                   (auVar84._4_4_ * 0.6931472 + fVar105 +
                   fVar105 * fVar105 *
                   (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) * fVar105 +
                         -0.12420141) * fVar105 + 0.14249323) * fVar105 + -0.16668057) * fVar105 +
                      0.20000714) * fVar105 + -0.24999994) * fVar105 + 0.3333333) * fVar105 + -0.5))
                   * -2.0;
              auVar86._8_4_ =
                   (auVar84._8_4_ * 0.6931472 + fVar106 +
                   fVar106 * fVar106 *
                   (((((((((fVar106 * 0.070376836 + -0.1151461) * fVar106 + 0.116769984) * fVar106 +
                         -0.12420141) * fVar106 + 0.14249323) * fVar106 + -0.16668057) * fVar106 +
                      0.20000714) * fVar106 + -0.24999994) * fVar106 + 0.3333333) * fVar106 + -0.5))
                   * -2.0;
              auVar86._12_4_ =
                   (auVar84._12_4_ * 0.6931472 + fVar108 +
                   fVar108 * fVar108 *
                   (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) * fVar108 +
                         -0.12420141) * fVar108 + 0.14249323) * fVar108 + -0.16668057) * fVar108 +
                      0.20000714) * fVar108 + -0.24999994) * fVar108 + 0.3333333) * fVar108 + -0.5))
                   * -2.0;
              auVar115._8_4_ = 0x7fffffff;
              auVar115._0_8_ = 0x7fffffff7fffffff;
              auVar115._12_4_ = 0x7fffffff;
              auVar84 = vblendvps_avx(auVar86,auVar115,auVar120);
              auVar136._8_4_ = 0x42b0c0a5;
              auVar136._0_8_ = 0x42b0c0a542b0c0a5;
              auVar136._12_4_ = 0x42b0c0a5;
              auVar84 = vminps_avx(auVar84,auVar136);
              auVar144._8_4_ = 0xc2b0c0a5;
              auVar144._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar144._12_4_ = 0xc2b0c0a5;
              auVar114 = vmaxps_avx(auVar144,auVar84);
              auVar87._0_4_ = auVar114._0_4_ * 1.442695 + 0.5;
              auVar87._4_4_ = auVar114._4_4_ * 1.442695 + 0.5;
              auVar87._8_4_ = auVar114._8_4_ * 1.442695 + 0.5;
              auVar87._12_4_ = auVar114._12_4_ * 1.442695 + 0.5;
              auVar116._0_4_ = (int)auVar87._0_4_;
              auVar116._4_4_ = (int)auVar87._4_4_;
              auVar116._8_4_ = (int)auVar87._8_4_;
              auVar116._12_4_ = (int)auVar87._12_4_;
              auVar120 = vcvtdq2ps_avx(auVar116);
              auVar84 = vcmpps_avx(auVar87,auVar120,1);
              auVar84 = vandps_avx(auVar143,auVar84);
              auVar84 = vsubps_avx(auVar120,auVar84);
              auVar117._0_4_ = auVar84._0_4_ * 0.6931472;
              auVar117._4_4_ = auVar84._4_4_ * 0.6931472;
              auVar117._8_4_ = auVar84._8_4_ * 0.6931472;
              auVar117._12_4_ = auVar84._12_4_ * 0.6931472;
              auVar120 = vsubps_avx(auVar114,auVar117);
              fVar78 = auVar120._0_4_;
              fVar105 = auVar120._4_4_;
              fVar106 = auVar120._8_4_;
              fVar108 = auVar120._12_4_;
              auVar88._0_4_ = (int)auVar84._0_4_;
              auVar88._4_4_ = (int)auVar84._4_4_;
              auVar88._8_4_ = (int)auVar84._8_4_;
              auVar88._12_4_ = (int)auVar84._12_4_;
              auVar84 = vpslld_avx(auVar88,0x17);
              auVar84 = vpaddd_avx(auVar143,auVar84);
              auVar53._0_4_ =
                   (fVar78 + 1.0 +
                   fVar78 * fVar78 *
                   (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                     0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar84._0_4_ + 1.0;
              auVar53._4_4_ =
                   (fVar105 + 1.0 +
                   fVar105 * fVar105 *
                   (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                     0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar84._4_4_ + 1.0;
              auVar53._8_4_ =
                   (fVar106 + 1.0 +
                   fVar106 * fVar106 *
                   (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                     0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5)) * auVar84._8_4_ + 1.0;
              auVar53._12_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar84._12_4_ + 1.0;
              auVar84 = vrcpps_avx(auVar53);
              fVar78 = auVar84._0_4_;
              fVar105 = auVar84._4_4_;
              fVar106 = auVar84._8_4_;
              fVar108 = auVar84._12_4_;
              auVar54._0_4_ = auVar53._0_4_ * (fVar78 + fVar78);
              auVar54._4_4_ = auVar53._4_4_ * (fVar105 + fVar105);
              auVar54._8_4_ = auVar53._8_4_ * (fVar106 + fVar106);
              auVar54._12_4_ = auVar53._12_4_ * (fVar108 + fVar108);
              auVar130._8_4_ = 0x40000000;
              auVar130._0_8_ = 0x4000000040000000;
              auVar130._12_4_ = 0x40000000;
              auVar84 = vsubps_avx(auVar130,auVar54);
              auVar55._0_4_ = (fVar78 + fVar78 + -1.0 + fVar78 * auVar84._0_4_) * fVar79;
              auVar55._4_4_ = (fVar105 + fVar105 + -1.0 + fVar105 * auVar84._4_4_) * fVar44;
              auVar55._8_4_ = (fVar106 + fVar106 + -1.0 + fVar106 * auVar84._8_4_) * fVar107;
              auVar55._12_4_ = (fVar108 + fVar108 + -1.0 + fVar108 * auVar84._12_4_) * fVar109;
              auVar84 = vminps_avx(auVar45,auVar136);
              auVar114 = vmaxps_avx(auVar144,auVar84);
              auVar89._0_4_ = auVar114._0_4_ * 1.442695 + 0.5;
              auVar89._4_4_ = auVar114._4_4_ * 1.442695 + 0.5;
              auVar89._8_4_ = auVar114._8_4_ * 1.442695 + 0.5;
              auVar89._12_4_ = auVar114._12_4_ * 1.442695 + 0.5;
              auVar118._0_4_ = (int)auVar89._0_4_;
              auVar118._4_4_ = (int)auVar89._4_4_;
              auVar118._8_4_ = (int)auVar89._8_4_;
              auVar118._12_4_ = (int)auVar89._12_4_;
              auVar120 = vcvtdq2ps_avx(auVar118);
              auVar84 = vcmpps_avx(auVar89,auVar120,1);
              auVar84 = vandps_avx(auVar143,auVar84);
              auVar84 = vsubps_avx(auVar120,auVar84);
              auVar119._0_4_ = auVar84._0_4_ * 0.6931472;
              auVar119._4_4_ = auVar84._4_4_ * 0.6931472;
              auVar119._8_4_ = auVar84._8_4_ * 0.6931472;
              auVar119._12_4_ = auVar84._12_4_ * 0.6931472;
              auVar120 = vsubps_avx(auVar114,auVar119);
              fVar79 = auVar120._0_4_;
              fVar44 = auVar120._4_4_;
              fVar107 = auVar120._8_4_;
              fVar109 = auVar120._12_4_;
              auVar90._0_4_ = (int)auVar84._0_4_;
              auVar90._4_4_ = (int)auVar84._4_4_;
              auVar90._8_4_ = (int)auVar84._8_4_;
              auVar90._12_4_ = (int)auVar84._12_4_;
              auVar84 = vpslld_avx(auVar90,0x17);
              auVar84 = vpaddd_avx(auVar143,auVar84);
              auVar66._0_4_ =
                   (fVar79 + 1.0 +
                   fVar79 * fVar79 *
                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                     0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5)) * auVar84._0_4_ + 1.0;
              auVar66._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar84._4_4_ + 1.0;
              auVar66._8_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar84._8_4_ + 1.0;
              auVar66._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar84._12_4_ + 1.0;
              auVar91._8_4_ = 0x800000;
              auVar91._0_8_ = 0x80000000800000;
              auVar91._12_4_ = 0x800000;
              auVar84 = vmaxps_avx(auVar66,auVar91);
              auVar120 = vpsrld_avx(auVar84,0x17);
              auVar131._8_4_ = 0x807fffff;
              auVar131._0_8_ = 0x807fffff807fffff;
              auVar131._12_4_ = 0x807fffff;
              auVar84 = vandps_avx(auVar84,auVar131);
              auVar76 = vorps_avx(auVar138,auVar84);
              auVar132._8_4_ = 0xffffff82;
              auVar132._0_8_ = 0xffffff82ffffff82;
              auVar132._12_4_ = 0xffffff82;
              auVar84 = vpaddd_avx(auVar120,auVar132);
              auVar114 = vcvtdq2ps_avx(auVar84);
              auVar133._8_4_ = 0x3f3504f3;
              auVar133._0_8_ = 0x3f3504f33f3504f3;
              auVar133._12_4_ = 0x3f3504f3;
              auVar120 = vcmpps_avx(auVar76,auVar133,1);
              auVar84 = vandps_avx(auVar120,auVar76);
              fVar79 = auVar76._0_4_ + -1.0 + auVar84._0_4_;
              fVar44 = auVar76._4_4_ + -1.0 + auVar84._4_4_;
              fVar107 = auVar76._8_4_ + -1.0 + auVar84._8_4_;
              fVar109 = auVar76._12_4_ + -1.0 + auVar84._12_4_;
              auVar84 = vandps_avx(auVar143,auVar120);
              auVar84 = vsubps_avx(auVar114,auVar84);
              auVar97 = vcmpps_avx(auVar66,auVar97,2);
              auVar92._0_4_ =
                   (auVar84._0_4_ * 0.6931472 + fVar79 +
                   fVar79 * fVar79 *
                   (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) * fVar79 +
                         -0.12420141) * fVar79 + 0.14249323) * fVar79 + -0.16668057) * fVar79 +
                      0.20000714) * fVar79 + -0.24999994) * fVar79 + 0.3333333) * fVar79 + -0.5)) *
                   -2.0;
              auVar92._4_4_ =
                   (auVar84._4_4_ * 0.6931472 + fVar44 +
                   fVar44 * fVar44 *
                   (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                         -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                      0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5)) *
                   -2.0;
              auVar92._8_4_ =
                   (auVar84._8_4_ * 0.6931472 + fVar107 +
                   fVar107 * fVar107 *
                   (((((((((fVar107 * 0.070376836 + -0.1151461) * fVar107 + 0.116769984) * fVar107 +
                         -0.12420141) * fVar107 + 0.14249323) * fVar107 + -0.16668057) * fVar107 +
                      0.20000714) * fVar107 + -0.24999994) * fVar107 + 0.3333333) * fVar107 + -0.5))
                   * -2.0;
              auVar92._12_4_ =
                   (auVar84._12_4_ * 0.6931472 + fVar109 +
                   fVar109 * fVar109 *
                   (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                         -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                      0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5))
                   * -2.0;
              auVar121._8_4_ = 0x7fffffff;
              auVar121._0_8_ = 0x7fffffff7fffffff;
              auVar121._12_4_ = 0x7fffffff;
              auVar97 = vblendvps_avx(auVar92,auVar121,auVar97);
              auVar93._8_4_ = 0x42b0c0a5;
              auVar93._0_8_ = 0x42b0c0a542b0c0a5;
              auVar93._12_4_ = 0x42b0c0a5;
              auVar97 = vminps_avx(auVar97,auVar93);
              auVar94._8_4_ = 0xc2b0c0a5;
              auVar94._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar94._12_4_ = 0xc2b0c0a5;
              auVar120 = vmaxps_avx(auVar97,auVar94);
              auVar95._0_4_ = auVar120._0_4_ * 1.442695 + 0.5;
              auVar95._4_4_ = auVar120._4_4_ * 1.442695 + 0.5;
              auVar95._8_4_ = auVar120._8_4_ * 1.442695 + 0.5;
              auVar95._12_4_ = auVar120._12_4_ * 1.442695 + 0.5;
              auVar122._0_4_ = (int)auVar95._0_4_;
              auVar122._4_4_ = (int)auVar95._4_4_;
              auVar122._8_4_ = (int)auVar95._8_4_;
              auVar122._12_4_ = (int)auVar95._12_4_;
              auVar84 = vcvtdq2ps_avx(auVar122);
              auVar97 = vcmpps_avx(auVar95,auVar84,1);
              auVar97 = vandps_avx(auVar143,auVar97);
              auVar97 = vsubps_avx(auVar84,auVar97);
              auVar123._0_4_ = auVar97._0_4_ * 0.6931472;
              auVar123._4_4_ = auVar97._4_4_ * 0.6931472;
              auVar123._8_4_ = auVar97._8_4_ * 0.6931472;
              auVar123._12_4_ = auVar97._12_4_ * 0.6931472;
              auVar84 = vsubps_avx(auVar120,auVar123);
              fVar79 = auVar84._0_4_;
              fVar44 = auVar84._4_4_;
              fVar107 = auVar84._8_4_;
              fVar109 = auVar84._12_4_;
              auVar96._0_4_ = (int)auVar97._0_4_;
              auVar96._4_4_ = (int)auVar97._4_4_;
              auVar96._8_4_ = (int)auVar97._8_4_;
              auVar96._12_4_ = (int)auVar97._12_4_;
              auVar97 = vpslld_avx(auVar96,0x17);
              auVar97 = vpaddd_avx(auVar143,auVar97);
              auVar67._0_4_ =
                   (fVar79 + 1.0 +
                   fVar79 * fVar79 *
                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                     0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5)) * auVar97._0_4_ + 1.0;
              auVar67._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar97._4_4_ + 1.0;
              auVar67._8_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar97._8_4_ + 1.0;
              auVar67._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar97._12_4_ + 1.0;
              auVar97 = vrcpps_avx(auVar67);
              fVar79 = auVar97._0_4_;
              fVar44 = auVar97._4_4_;
              fVar107 = auVar97._8_4_;
              fVar109 = auVar97._12_4_;
              auVar68._0_4_ = auVar67._0_4_ * (fVar79 + fVar79);
              auVar68._4_4_ = auVar67._4_4_ * (fVar44 + fVar44);
              auVar68._8_4_ = auVar67._8_4_ * (fVar107 + fVar107);
              auVar68._12_4_ = auVar67._12_4_ * (fVar109 + fVar109);
              auVar134._8_4_ = 0x40000000;
              auVar134._0_8_ = 0x4000000040000000;
              auVar134._12_4_ = 0x40000000;
              auVar97 = vsubps_avx(auVar134,auVar68);
              auVar69._0_4_ = fVar79 + fVar79 + -1.0 + fVar79 * auVar97._0_4_;
              auVar69._4_4_ = fVar44 + fVar44 + -1.0 + fVar44 * auVar97._4_4_;
              auVar69._8_4_ = fVar107 + fVar107 + -1.0 + fVar107 * auVar97._8_4_;
              auVar69._12_4_ = fVar109 + fVar109 + -1.0 + fVar109 * auVar97._12_4_;
              goto LAB_00262bd1;
            case 6:
              fVar78 = **(float **)(&this->field_0x118 + (long)p_Var12);
              fVar105 = (*(float **)(&this->field_0x118 + (long)p_Var12))[1];
              auVar59._0_4_ = fVar78 * fVar79 + fVar105;
              auVar59._4_4_ = fVar78 * fVar44 + fVar105;
              auVar59._8_4_ = fVar78 * fVar107 + fVar105;
              auVar59._12_4_ = fVar78 * fVar109 + fVar105;
              auVar84 = vmaxps_avx(auVar59,auVar97);
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              auVar84 = vminps_avx(auVar84,auVar135);
              auVar55._0_4_ = auVar84._0_4_ * fVar79;
              auVar55._4_4_ = auVar84._4_4_ * fVar44;
              auVar55._8_4_ = auVar84._8_4_ * fVar107;
              auVar55._12_4_ = auVar84._12_4_ * fVar109;
              auVar75._0_4_ = fVar78 * auVar45._0_4_ + fVar105;
              auVar75._4_4_ = fVar78 * auVar45._4_4_ + fVar105;
              auVar75._8_4_ = fVar78 * fVar1 + fVar105;
              auVar75._12_4_ = fVar78 * fVar5 + fVar105;
              auVar97 = vmaxps_avx(auVar75,auVar97);
              auVar69 = vminps_avx(auVar97,auVar135);
LAB_00262bd1:
              auVar103._0_4_ = auVar69._0_4_ * auVar45._0_4_;
              auVar103._4_4_ = auVar69._4_4_ * auVar45._4_4_;
              auVar103._8_4_ = auVar69._8_4_ * fVar1;
              auVar103._12_4_ = auVar69._12_4_ * fVar5;
            }
switchD_002623ec_caseD_1:
            if (iVar2 < 0x65) {
              *pauVar25 = auVar55;
              pauVar25[1] = auVar103;
              pauVar25 = pauVar25 + 2;
            }
            else {
              pfVar36 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var12) + uVar39 * 0x20);
              auVar49._0_4_ = auVar55._0_4_ * *pfVar36;
              auVar49._4_4_ = auVar55._4_4_ * pfVar36[1];
              auVar49._8_4_ = auVar55._8_4_ * pfVar36[2];
              auVar49._12_4_ = auVar55._12_4_ * pfVar36[3];
              pfVar36 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var12) + 0x10 +
                                 uVar39 * 0x20);
              auVar60._0_4_ = auVar103._0_4_ * *pfVar36;
              auVar60._4_4_ = auVar103._4_4_ * pfVar36[1];
              auVar60._8_4_ = auVar103._8_4_ * pfVar36[2];
              auVar60._12_4_ = auVar103._12_4_ * pfVar36[3];
              auVar104._8_4_ = 0x80000000;
              auVar104._0_8_ = 0x8000000080000000;
              auVar104._12_4_ = 0x80000000;
              auVar97 = vandps_avx(auVar49,auVar104);
              auVar84 = vandps_avx(auVar60,auVar104);
              auVar125._8_4_ = 0x3f000000;
              auVar125._0_8_ = 0x3f0000003f000000;
              auVar125._12_4_ = 0x3f000000;
              auVar97 = vorps_avx(auVar97,auVar125);
              auVar84 = vorps_avx(auVar84,auVar125);
              auVar50._0_4_ = (int)(auVar49._0_4_ + auVar97._0_4_);
              auVar50._4_4_ = (int)(auVar49._4_4_ + auVar97._4_4_);
              auVar50._8_4_ = (int)(auVar49._8_4_ + auVar97._8_4_);
              auVar50._12_4_ = (int)(auVar49._12_4_ + auVar97._12_4_);
              auVar61._0_4_ = (int)(auVar60._0_4_ + auVar84._0_4_);
              auVar61._4_4_ = (int)(auVar60._4_4_ + auVar84._4_4_);
              auVar61._8_4_ = (int)(auVar60._8_4_ + auVar84._8_4_);
              auVar61._12_4_ = (int)(auVar60._12_4_ + auVar84._12_4_);
              auVar97 = vpackssdw_avx(auVar50,auVar61);
              auVar97 = vpminsw_avx(auVar97,_DAT_002dc950);
              auVar97 = vpmaxsw_avx(auVar97,_DAT_002dc960);
              auVar97 = vpacksswb_avx(auVar97,auVar97);
              *puVar21 = auVar97._0_8_;
              puVar21 = puVar21 + 1;
            }
          }
        }
        Mat::~Mat(&scales);
        iVar37 = iVar37 + (int)uVar40 * 8;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&top_blob_unpacked);
    iVar37 = 0;
    goto LAB_0026207b;
  }
  sVar24 = (ulong)opt->use_packing_layout * 3 + 1;
  iVar18 = 1;
  if ((*(uint *)(&this->field_0xd0 + (long)p_Var12) & 3) != 0) {
    sVar24 = 1;
  }
  uVar38 = (uint)sVar24;
  uVar40 = (ulong)(uVar38 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var12)) {
    uVar40 = sVar24;
  }
  Mat::create(top_blob,iVar28,iVar9,(int)*(uint *)(&this->field_0xd0 + (long)p_Var12) / (int)uVar38,
              uVar40,uVar38,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0026207b;
  uVar20 = (int)uVar20 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  uVar10 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  uVar19 = 1;
  if (opt->use_packing_layout == true) {
    iVar18 = 1;
    if ((uVar20 & 7) == 0) {
      iVar18 = 8;
    }
    uVar19 = (uint)((uVar10 & 3) == 0) * 3 + 1;
  }
  piVar6 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  scales.refcount =
       (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  scales.data = bottom_blob_bordered.data;
  scales.elemsize = bottom_blob_bordered.elemsize;
  scales.elempack = bottom_blob_bordered.elempack;
  scales.allocator = bottom_blob_bordered.allocator;
  scales.w = bottom_blob_bordered.w;
  scales.dims = bottom_blob_bordered.dims;
  scales.d = bottom_blob_bordered.d;
  scales.h = bottom_blob_bordered.h;
  scales.c = bottom_blob_bordered.c;
  scales.cstep = bottom_blob_bordered.cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  if (iVar18 < iVar14) {
    top_blob_unpacked.data = *(void **)opt;
    top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
    top_blob_unpacked.elempack = opt->openmp_blocktime;
    top_blob_unpacked._28_1_ = opt->use_winograd_convolution;
    top_blob_unpacked._29_1_ = opt->use_sgemm_convolution;
    top_blob_unpacked._30_1_ = opt->use_int8_inference;
    top_blob_unpacked._31_1_ = opt->use_vulkan_compute;
    top_blob_unpacked.allocator._0_1_ = opt->use_bf16_storage;
    top_blob_unpacked.allocator._1_1_ = opt->use_fp16_packed;
    top_blob_unpacked.allocator._2_1_ = opt->use_fp16_storage;
    top_blob_unpacked.allocator._3_1_ = opt->use_fp16_arithmetic;
    top_blob_unpacked.allocator._4_1_ = opt->use_int8_packed;
    top_blob_unpacked.allocator._5_1_ = opt->use_int8_storage;
    top_blob_unpacked.allocator._6_1_ = opt->use_int8_arithmetic;
    top_blob_unpacked.allocator._7_1_ = opt->use_packing_layout;
    top_blob_unpacked.dims._0_1_ = opt->use_shader_pack8;
    top_blob_unpacked.dims._1_1_ = opt->use_subgroup_basic;
    top_blob_unpacked.dims._2_1_ = opt->use_subgroup_vote;
    top_blob_unpacked.dims._3_1_ = opt->use_subgroup_ballot;
    top_blob_unpacked.w._0_1_ = opt->use_subgroup_shuffle;
    top_blob_unpacked.w._1_1_ = opt->use_image_storage;
    top_blob_unpacked.w._2_1_ = opt->use_tensor_storage;
    top_blob_unpacked.w._3_1_ = opt->use_weight_fp16_storage;
    top_blob_unpacked.h = opt->flush_denormals;
    top_blob_unpacked.d._0_1_ = opt->use_local_pool_allocator;
    top_blob_unpacked.d._1_1_ = opt->use_reserved_1;
    top_blob_unpacked.d._2_1_ = opt->use_reserved_2;
    top_blob_unpacked.d._3_1_ = opt->use_reserved_3;
    top_blob_unpacked.c._0_1_ = opt->use_reserved_4;
    top_blob_unpacked.c._1_1_ = opt->use_reserved_5;
    top_blob_unpacked.c._2_1_ = opt->use_reserved_6;
    top_blob_unpacked.c._3_1_ = opt->use_reserved_7;
    top_blob_unpacked._60_1_ = opt->use_reserved_8;
    top_blob_unpacked._61_1_ = opt->use_reserved_9;
    top_blob_unpacked._62_1_ = opt->use_reserved_10;
    top_blob_unpacked._63_1_ = opt->use_reserved_11;
    top_blob_unpacked.refcount = (int *)opt->workspace_allocator;
    convert_packing(&bottom_blob_bordered,&scales,iVar18,(Option *)&top_blob_unpacked);
  }
  Mat::Mat(&top_blob_unpacked,top_blob);
  if (uVar19 < uVar38) {
    local_278 = (byte)uVar40;
    Mat::create(&top_blob_unpacked,iVar28,iVar9,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
                (int)uVar19,(ulong)((byte)(local_278 / (byte)sVar24) * uVar19),uVar19,
                opt->workspace_allocator);
    iVar37 = -100;
    if ((top_blob_unpacked.data != (void *)0x0) &&
       ((long)top_blob_unpacked.c * top_blob_unpacked.cstep != 0)) goto LAB_00261f34;
  }
  else {
LAB_00261f34:
    iVar14 = 0;
    iVar37 = 0;
    for (lVar33 = 0;
        lVar33 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
        lVar33 = lVar33 + 1) {
      Mat::channel_range((Mat *)&requantize_scales,&scales,iVar14 / iVar18,(int)uVar20 / iVar18);
      Mat::channel_range(&top_blob_g,&top_blob_unpacked,iVar37 / (int)uVar19,
                         (int)uVar10 / (int)uVar19);
      pLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar33];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_reserved_1 = opt->use_reserved_1;
      opt_g.use_reserved_2 = opt->use_reserved_2;
      opt_g.use_reserved_3 = opt->use_reserved_3;
      opt_g.use_reserved_4 = opt->use_reserved_4;
      opt_g.use_reserved_5 = opt->use_reserved_5;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = top_blob->allocator;
      (*pLVar4->_vptr_Layer[7])(pLVar4,(Mat *)&requantize_scales,&top_blob_g,&opt_g);
      Mat::~Mat(&top_blob_g);
      Mat::~Mat((Mat *)&requantize_scales);
      iVar37 = iVar37 + uVar10;
      iVar14 = iVar14 + uVar20;
    }
    if (uVar19 < uVar38) {
      convert_packing(&top_blob_unpacked,top_blob,uVar38,opt);
    }
    else {
      Mat::operator=(top_blob,&top_blob_unpacked);
    }
    iVar37 = 0;
  }
  Mat::~Mat(&top_blob_unpacked);
  Mat::~Mat(&scales);
LAB_0026207b:
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_int8);
  return iVar37;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}